

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

string * units::generateUnitSequence(string *__return_storage_ptr__,double mux,string *seq)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  _Alloc_hider __nptr;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long *plVar7;
  int *piVar8;
  long lVar9;
  undefined8 uVar10;
  char *pcVar11;
  size_type *psVar12;
  bool numOnly;
  bool numOnly_00;
  byte bVar13;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  bool numOnly_01;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 uVar14;
  bool numOnly_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  undefined1 extraout_DL_05;
  bool numOnly_03;
  undefined1 extraout_DL_06;
  undefined1 extraout_DL_07;
  undefined1 extraout_DL_08;
  undefined1 extraout_DL_09;
  undefined1 extraout_DL_10;
  undefined1 extraout_DL_11;
  undefined1 extraout_DL_12;
  undefined1 extraout_DL_13;
  char *pcVar15;
  byte bVar16;
  double dVar17;
  string muxstr;
  string local_78;
  string local_58;
  int local_34;
  
  iVar4 = std::__cxx11::string::compare((ulong)seq,0,(char *)0x3);
  if (iVar4 == 0) {
    if (0.1 < mux) {
LAB_0015ed46:
      bVar16 = 0;
    }
    else {
      pcVar11 = "L";
      pcVar15 = (char *)0x3;
LAB_0015ed06:
      bVar16 = 0;
      std::__cxx11::string::replace((ulong)seq,0,pcVar15,(ulong)pcVar11);
      mux = mux * 1000.0;
    }
  }
  else {
    iVar4 = std::__cxx11::string::compare((ulong)seq,0,(char *)0x4);
    if (iVar4 == 0) {
      if (mux <= 100.0) goto LAB_0015ed46;
      pcVar11 = "L^-1";
      pcVar15 = (char *)0x4;
LAB_0015ed6b:
      bVar16 = 0;
      std::__cxx11::string::replace((ulong)seq,0,pcVar15,(ulong)pcVar11);
      mux = mux / 1000.0;
    }
    else {
      iVar4 = std::__cxx11::string::compare((ulong)seq,0,(char *)0x5);
      if (iVar4 == 0) {
        bVar16 = 1;
        if (100.0 < mux) {
          pcVar11 = "g^-1";
          pcVar15 = (char *)0x5;
          goto LAB_0015ed6b;
        }
      }
      else {
        bVar16 = 0;
        iVar4 = std::__cxx11::string::compare((ulong)seq,0,(char *)0x2);
        if (((iVar4 == 0) && (bVar16 = 1, mux <= 0.1)) &&
           ((seq->_M_string_length < 4 || ((seq->_M_dataplus)._M_p[2] != '^')))) {
          pcVar11 = "g";
          pcVar15 = (char *)0x2;
          goto LAB_0015ed06;
        }
      }
    }
  }
  cVar2 = *(seq->_M_dataplus)._M_p;
  if ((mux == 1.0) && (!NAN(mux))) {
    if (cVar2 == '/') {
      std::__cxx11::string::_M_replace_aux((ulong)seq,0,0,'\x01');
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (seq->_M_dataplus)._M_p;
    paVar1 = &seq->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar1) {
      uVar10 = *(undefined8 *)((long)&seq->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar10;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = seq->_M_string_length;
    (seq->_M_dataplus)._M_p = (pointer)paVar1;
    seq->_M_string_length = 0;
    (seq->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  uVar5 = std::__cxx11::string::find((char)seq,0x5e);
  if (cVar2 != '/') {
    if (uVar5 == 0xffffffffffffffff) {
      getMultiplierString_abi_cxx11_(&local_58,(units *)(ulong)bVar16,mux,numOnly);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_58,(ulong)(seq->_M_dataplus)._M_p);
    }
    else {
      uVar6 = std::__cxx11::string::find_first_of((char *)seq,0x179fee,0);
      if (uVar5 <= uVar6) {
        std::__cxx11::string::substr((ulong)&local_58,(ulong)seq);
        __nptr._M_p = local_58._M_dataplus._M_p;
        piVar8 = __errno_location();
        local_34 = *piVar8;
        *piVar8 = 0;
        lVar9 = strtol(__nptr._M_p,(char **)&local_78,10);
        if (local_78._M_dataplus._M_p == __nptr._M_p) {
          std::__throw_invalid_argument("stoi");
LAB_0015f688:
          uVar10 = std::__throw_out_of_range("stoi");
          if (local_58._M_dataplus._M_p != __nptr._M_p) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
          _Unwind_Resume(uVar10);
        }
        if (((int)lVar9 != lVar9) || (*piVar8 == 0x22)) goto LAB_0015f688;
        if (*piVar8 == 0) {
          *piVar8 = local_34;
        }
        paVar1 = &local_58.field_2;
        uVar14 = extraout_DL;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar1) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
          uVar14 = extraout_DL_00;
        }
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        local_58._M_dataplus._M_p = (pointer)paVar1;
        switch((int)lVar9) {
        default:
          getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)uVar14);
          std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_0015f64c:
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          break;
        case 2:
          if (mux < 0.0) {
            dVar17 = sqrt(mux);
            uVar14 = extraout_DL_11;
          }
          else {
            dVar17 = SQRT(mux);
          }
          getMultiplierString_abi_cxx11_(&local_78,(units *)(ulong)bVar16,dVar17,(bool)uVar14);
          std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
          uVar14 = extraout_DL_12;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            uVar14 = extraout_DL_13;
          }
          bVar16 = *local_58._M_dataplus._M_p;
          if (((byte)(bVar16 - 0x30) < 10) ||
             ((bVar16 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar16 & 0x3f) & 1) != 0)))) {
            getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)uVar14);
            goto LAB_0015f632;
          }
          break;
        case 3:
          dVar17 = cbrt(mux);
          getMultiplierString_abi_cxx11_(&local_78,(units *)(ulong)bVar16,dVar17,numOnly_03);
          std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
          uVar14 = extraout_DL_06;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            uVar14 = extraout_DL_07;
          }
          bVar16 = *local_58._M_dataplus._M_p;
          if (((byte)(bVar16 - 0x30) < 10) ||
             ((bVar16 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar16 & 0x3f) & 1) != 0)))) {
            getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)uVar14);
            goto LAB_0015f632;
          }
          break;
        case -3:
          dVar17 = cbrt(1.0 / mux);
          getMultiplierString_abi_cxx11_(&local_78,(units *)(ulong)bVar16,dVar17,numOnly_01);
          std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
          uVar14 = extraout_DL_01;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            uVar14 = extraout_DL_02;
          }
          bVar16 = *local_58._M_dataplus._M_p;
          if (((byte)(bVar16 - 0x30) < 10) ||
             ((bVar16 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar16 & 0x3f) & 1) != 0)))) {
            getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)uVar14);
LAB_0015f632:
            std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) goto LAB_0015f64c;
          }
          break;
        case -2:
          dVar17 = 1.0 / mux;
          if (dVar17 < 0.0) {
            dVar17 = sqrt(dVar17);
            uVar14 = extraout_DL_08;
          }
          else {
            dVar17 = SQRT(dVar17);
          }
          getMultiplierString_abi_cxx11_(&local_78,(units *)(ulong)bVar16,dVar17,(bool)uVar14);
          std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
          uVar14 = extraout_DL_09;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            uVar14 = extraout_DL_10;
          }
          bVar16 = *local_58._M_dataplus._M_p;
          if (((byte)(bVar16 - 0x30) < 10) ||
             ((bVar16 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar16 & 0x3f) & 1) != 0)))) {
            getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)uVar14);
            goto LAB_0015f632;
          }
          break;
        case -1:
          getMultiplierString_abi_cxx11_(&local_78,(units *)(ulong)bVar16,1.0 / mux,(bool)uVar14);
          std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
          uVar14 = extraout_DL_04;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            uVar14 = extraout_DL_05;
          }
          bVar16 = *local_58._M_dataplus._M_p;
          if (((byte)(bVar16 - 0x30) < 10) ||
             ((bVar16 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar16 & 0x3f) & 1) != 0)))) {
            getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)uVar14);
            goto LAB_0015f632;
          }
        }
        std::operator+(__return_storage_ptr__,&local_58,seq);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p == paVar1) {
          return __return_storage_ptr__;
        }
        goto LAB_0015f33e;
      }
      getMultiplierString_abi_cxx11_(&local_58,(units *)(ulong)bVar16,mux,numOnly_00);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_58,(ulong)(seq->_M_dataplus)._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar12 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar12) {
      lVar9 = plVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar9;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
    }
    __return_storage_ptr__->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0015f33e;
  }
  if (uVar5 == 0xffffffffffffffff) {
    iVar4 = 1;
  }
  else {
    iVar4 = (seq->_M_dataplus)._M_p[uVar5 + 1] + -0x30;
  }
  paVar1 = &local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar1;
  if (iVar4 == 3) {
    dVar17 = cbrt(1.0 / mux);
    getMultiplierString_abi_cxx11_(&local_78,(units *)(ulong)bVar16,dVar17,numOnly_02);
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    bVar16 = *local_58._M_dataplus._M_p;
    bVar13 = bVar16 - 0x30;
    if ((bVar13 < 10) ||
       ((bVar16 < 0x2f &&
        (bVar13 = false, (0x680000000000U >> ((ulong)(uint)bVar16 & 0x3f) & 1) != 0)))) {
      getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)bVar13);
      goto LAB_0015f2fd;
    }
LAB_0015f35d:
    std::__cxx11::string::replace((ulong)seq,1,(char *)0x0,(ulong)local_58._M_dataplus._M_p);
    std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)local_58._M_string_length,0x17ea9b);
  }
  else {
    if (iVar4 == 2) {
      dVar17 = 1.0 / mux;
      if (dVar17 < 0.0) {
        dVar17 = sqrt(dVar17);
        uVar14 = extraout_DL_03;
      }
      else {
        dVar17 = SQRT(dVar17);
        uVar14 = numOnly;
      }
      getMultiplierString_abi_cxx11_(&local_78,(units *)(ulong)bVar16,dVar17,(bool)uVar14);
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      bVar16 = *local_58._M_dataplus._M_p;
      bVar13 = bVar16 - 0x30;
      if ((9 < bVar13) &&
         ((0x2e < bVar16 ||
          (bVar13 = false, (0x680000000000U >> ((ulong)(uint)bVar16 & 0x3f) & 1) == 0))))
      goto LAB_0015f35d;
      getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)bVar13);
LAB_0015f2fd:
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_0015f324;
    }
    else {
      if (iVar4 == 1) {
        getMultiplierString_abi_cxx11_(&local_78,(units *)(ulong)bVar16,1.0 / mux,numOnly);
        std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        bVar16 = *local_58._M_dataplus._M_p;
        bVar13 = bVar16 - 0x30;
        if ((9 < bVar13) &&
           ((0x2e < bVar16 ||
            (bVar13 = false, (0x680000000000U >> ((ulong)(uint)bVar16 & 0x3f) & 1) == 0))))
        goto LAB_0015f35d;
        getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)bVar13);
        goto LAB_0015f2fd;
      }
      getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,numOnly);
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_0015f324;
    }
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
LAB_0015f324:
  std::operator+(__return_storage_ptr__,&local_58,seq);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == paVar1) {
    return __return_storage_ptr__;
  }
LAB_0015f33e:
  operator_delete(local_58._M_dataplus._M_p,
                  CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                           local_58.field_2._M_local_buf[0]) + 1);
  return __return_storage_ptr__;
}

Assistant:

static std::string generateUnitSequence(double mux, std::string seq)
{
    bool noPrefix = false;
    // deal with a few common things
    if (seq.compare(0, 3, "m^3") == 0) {
        if (mux <= 0.1) {
            seq.replace(0, 3, "L");
            mux *= 1000.0;
        }
    } else if (seq.compare(0, 4, "m^-3") == 0) {
        if (mux > 100.0) {
            seq.replace(0, 4, "L^-1");
            mux /= 1000.0;
        }
    } else if (seq.compare(0, 5, "kg^-1") == 0) {
        if (mux > 100.0) {
            seq.replace(0, 5, "g^-1");
            mux /= 1000.0;
        } else {
            noPrefix = true;
        }
    } else if (seq.compare(0, 2, "kg") == 0) {
        if (mux <= 0.1) {
            if (seq.size() > 3 && seq[2] == '^') {
                noPrefix = true;
            } else {
                seq.replace(0, 2, "g");
                mux *= 1000.0;
            }
        } else {
            noPrefix = true;
        }
    }
    if (mux == 1.0) {
        if (seq.front() == '/') {
            seq.insert(seq.begin(), '1');
        }
        return seq;
    }
    if (seq.front() == '/') {
        int pw = 1;
        auto pwerloc = seq.find_first_of('^');
        if (pwerloc != std::string::npos) {
#ifdef UNITS_CONSTEXPR_IF_SUPPORTED
            if constexpr (
                detail::bitwidth::base_size == sizeof(std::uint32_t)) {
                pw = seq[pwerloc + 1] - '0';
            } else {
                if (seq.size() <= pwerloc + 2 ||
                    !isDigitCharacter(seq[pwerloc + 2])) {
                    pw = seq[pwerloc + 1] - '0';
                } else {
                    pw = 10;
                }
            }
#else
            if (detail::bitwidth::base_size == sizeof(std::uint32_t) ||
                seq.size() <= pwerloc + 2 ||
                !isDigitCharacter(seq[pwerloc + 2])) {
                pw = seq[pwerloc + 1] - '0';
            } else {
                pw = 10;
            }
#endif
        }
        std::string muxstr;
        switch (pw) {
            case 1:
                muxstr = getMultiplierString(1.0 / mux, noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            case 2:
                muxstr = getMultiplierString(std::sqrt(1.0 / mux), noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            case 3:
                muxstr = getMultiplierString(std::cbrt(1.0 / mux), noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            default:
                muxstr = getMultiplierString(mux, true);
        }
        return muxstr + seq;
    }
    auto pwerloc = seq.find_first_of('^');
    if (pwerloc == std::string::npos) {
        return getMultiplierString(mux, noPrefix) + seq;
    }
    auto mloc = seq.find_first_of("*/)");
    if (mloc < pwerloc) {
        return getMultiplierString(mux, noPrefix) + seq;
    }
    int offset = (seq[pwerloc + 1] != '(') ? 1 : 2;
    int pw = stoi(seq.substr(pwerloc + offset, mloc - pwerloc - offset + 1));
    std::string muxstr;
    switch (pw) {
        case -1:
            muxstr = getMultiplierString(1.0 / mux, noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case -2:
            muxstr = getMultiplierString(std::sqrt(1.0 / mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case -3:
            muxstr = getMultiplierString(std::cbrt(1.0 / mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case 2:
            muxstr = getMultiplierString(std::sqrt(mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case 3:
            muxstr = getMultiplierString(std::cbrt(mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        default:
            muxstr = getMultiplierString(mux, true);
    }
    return muxstr + seq;
}